

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_api_loader.cpp
# Opt level: O0

int getDebugLineDefined(lua_Debug *ar)

{
  lua_Debug *ar_local;
  
  switch(luaVersion) {
  case LUA_JIT:
  case LUA_51:
    ar_local._4_4_ = (ar->u).ar51.linedefined;
    break;
  case LUA_52:
    ar_local._4_4_ = (ar->u).ar51.nups;
    break;
  case LUA_53:
    ar_local._4_4_ = (ar->u).ar51.nups;
    break;
  case LUA_54:
    ar_local._4_4_ = (ar->u).ar51.lastlinedefined;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/emmy_debugger/src/api/lua_api_loader.cpp"
                  ,0xc3,"int getDebugLineDefined(lua_Debug *)");
  }
  return ar_local._4_4_;
}

Assistant:

int getDebugLineDefined(lua_Debug* ar)
{
	switch (luaVersion)
	{
	case LuaVersion::LUA_JIT:
	case LuaVersion::LUA_51:
		return ar->u.ar51.linedefined;
	case LuaVersion::LUA_52:
		return ar->u.ar52.linedefined;
	case LuaVersion::LUA_53:
		return ar->u.ar53.linedefined;
	case LuaVersion::LUA_54:
		return ar->u.ar54.linedefined;
	default:
		assert(false);
		return 0;
	}
}